

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

void __thiscall clipp::parser::add_miss_candidates_after(parser *this,scoped_dfs_traverser *match)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  dfs_traverser *pdVar4;
  pattern *ppVar5;
  anon_class_8_1_8991fb9c local_90;
  depth_first_traverser local_88;
  anon_class_16_2_5d972bcf local_70;
  depth_first_traverser local_60;
  group *local_48;
  group *newRepGroup;
  undefined1 local_30 [8];
  dfs_traverser npos;
  scoped_dfs_traverser *match_local;
  parser *this_local;
  
  npos.stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)match;
  pdVar4 = detail::scoped_dfs_traverser::base(match);
  group::depth_first_traverser::depth_first_traverser((depth_first_traverser *)local_30,pdVar4);
  bVar1 = group::depth_first_traverser::is_alternative((depth_first_traverser *)local_30,0);
  if (bVar1) {
    group::depth_first_traverser::skip_alternatives((depth_first_traverser *)local_30);
  }
  group::depth_first_traverser::operator++((depth_first_traverser *)local_30);
  local_48 = detail::scoped_dfs_traverser::innermost_repeat_group
                       ((scoped_dfs_traverser *)
                        npos.stack_.
                        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (local_48 == (group *)0x0) {
    ppVar5 = detail::scoped_dfs_traverser::operator->
                       ((scoped_dfs_traverser *)
                        npos.stack_.
                        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar1 = group::child_t<clipp::parameter,_clipp::group>::blocking(ppVar5);
    if (bVar1) {
      ppVar5 = detail::scoped_dfs_traverser::operator->
                         ((scoped_dfs_traverser *)
                          npos.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = group::child_t<clipp::parameter,_clipp::group>::required(ppVar5);
      if (!bVar1) {
        iVar2 = group::depth_first_traverser::level((depth_first_traverser *)local_30);
        pdVar4 = detail::scoped_dfs_traverser::base
                           ((scoped_dfs_traverser *)
                            npos.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        iVar3 = group::depth_first_traverser::level(pdVar4);
        if (iVar3 <= iVar2) {
          group::depth_first_traverser::depth_first_traverser
                    (&local_88,(depth_first_traverser *)local_30);
          local_90.this = this;
          for_each_potential_miss<clipp::parser::add_miss_candidates_after(clipp::detail::scoped_dfs_traverser_const&)::_lambda(clipp::group::depth_first_traverser_const&)_2_>
                    (&local_88,&local_90);
          group::depth_first_traverser::~depth_first_traverser(&local_88);
        }
      }
    }
  }
  else {
    bVar1 = detail::scoped_dfs_traverser::start_of_repeat_group(&this->pos_);
    if (bVar1) {
      group::depth_first_traverser::depth_first_traverser
                (&local_60,(depth_first_traverser *)local_30);
      local_70.newRepGroup = &local_48;
      local_70.this = this;
      for_each_potential_miss<clipp::parser::add_miss_candidates_after(clipp::detail::scoped_dfs_traverser_const&)::_lambda(clipp::group::depth_first_traverser_const&)_1_>
                (&local_60,&local_70);
      group::depth_first_traverser::~depth_first_traverser(&local_60);
    }
  }
  group::depth_first_traverser::~depth_first_traverser((depth_first_traverser *)local_30);
  return;
}

Assistant:

void add_miss_candidates_after(const scoped_dfs_traverser& match)
    {
        auto npos = match.base();
        if(npos.is_alternative()) npos.skip_alternatives();
        ++npos;
        //need to add potential misses if:
        //either new repeat group was started
        const auto newRepGroup = match.innermost_repeat_group();
        if(newRepGroup) {
            if(pos_.start_of_repeat_group()) {
                for_each_potential_miss(std::move(npos),
                    [&,this](const dfs_traverser& pos) {
                        //only add candidates within repeat group
                        if(newRepGroup == pos.innermost_repeat_group()) {
                            missCand_.emplace_back(pos, index_, true);
                        }
                    });
            }
        }
        //... or an optional blocking param was hit
        else if(match->blocking() && !match->required() &&
            npos.level() >= match.base().level())
        {
            for_each_potential_miss(std::move(npos),
                [&,this](const dfs_traverser& pos) {
                    //only add new candidates
                    if(std::find_if(missCand_.begin(), missCand_.end(),
                        [&](const miss_candidate& c){
                            return &(*c.pos) == &(*pos);
                        }) == missCand_.end())
                    {
                        missCand_.emplace_back(pos, index_);
                    }
                });
        }

    }